

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O0

void P_SerializePlayers(FArchive *arc,bool skipload)

{
  FArchive *this;
  bool bVar1;
  char *str;
  int local_18;
  byte local_13;
  byte local_12;
  byte local_11;
  int i;
  BYTE numPlayersNow;
  BYTE numPlayers;
  bool skipload_local;
  FArchive *arc_local;
  
  local_13 = 0;
  for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
    if ((playeringame[local_18] & 1U) != 0) {
      local_13 = local_13 + 1;
    }
  }
  local_11 = skipload;
  _i = arc;
  bVar1 = FArchive::IsStoring(arc);
  if (bVar1) {
    FArchive::operator<<(_i,&local_13);
    for (local_18 = 0; this = _i, local_18 < 8; local_18 = local_18 + 1) {
      if ((playeringame[local_18] & 1U) != 0) {
        str = userinfo_t::GetName((userinfo_t *)((long)local_18 * 0x2a0 + 0xd63498));
        FArchive::WriteString(this,str);
        player_t::Serialize((player_t *)(&players + (long)local_18 * 0x54),_i);
      }
    }
  }
  else {
    FArchive::operator<<(_i,&local_12);
    if (local_12 == 1) {
      ReadOnePlayer(_i,(bool)(local_11 & 1));
    }
    else {
      ReadMultiplePlayers(_i,(uint)local_12,(uint)local_13,(bool)(local_11 & 1));
    }
    if (((local_11 & 1) == 0) && (local_12 < local_13)) {
      SpawnExtraPlayers();
    }
    player_t::SendPitchLimits((player_t *)(&players + (long)consoleplayer * 0x54));
  }
  return;
}

Assistant:

void P_SerializePlayers (FArchive &arc, bool skipload)
{
	BYTE numPlayers, numPlayersNow;
	int i;

	// Count the number of players present right now.
	for (numPlayersNow = 0, i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i])
		{
			++numPlayersNow;
		}
	}

	if (arc.IsStoring())
	{
		// Record the number of players in this save.
		arc << numPlayersNow;

		// Record each player's name, followed by their data.
		for (i = 0; i < MAXPLAYERS; ++i)
		{
			if (playeringame[i])
			{
				arc.WriteString (players[i].userinfo.GetName());
				players[i].Serialize (arc);
			}
		}
	}
	else
	{
		arc << numPlayers;

		// If there is only one player in the game, they go to the
		// first player present, no matter what their name.
		if (numPlayers == 1)
		{
			ReadOnePlayer (arc, skipload);
		}
		else
		{
			ReadMultiplePlayers (arc, numPlayers, numPlayersNow, skipload);
		}
		if (!skipload && numPlayersNow > numPlayers)
		{
			SpawnExtraPlayers ();
		}
		// Redo pitch limits, since the spawned player has them at 0.
		players[consoleplayer].SendPitchLimits();
	}
}